

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

SystemTimingCheckSyntax * __thiscall slang::parsing::Parser::parseSystemTimingCheck(Parser *this)

{
  Token closeParen_00;
  Token openParen_00;
  bool bVar1;
  int iVar2;
  SourceLocation SVar3;
  TimingCheckArgSyntax *pTVar4;
  undefined4 extraout_var;
  SystemTimingCheckSyntax *pSVar5;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  TokenKind TVar6;
  Token TVar7;
  Token name;
  Token closeParen;
  Token openParen;
  Token local_268;
  Token local_258;
  SyntaxFactory *local_248;
  Info *local_240;
  undefined8 local_238;
  Token local_230;
  Token local_220;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_210;
  ulong local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  Token local_1d8;
  undefined1 local_1c8 [24];
  undefined1 auStack_1b0 [24];
  __extent_storage<18446744073709551615UL> local_198;
  
  TVar7 = ParserBase::consume(&this->super_ParserBase);
  local_240 = TVar7.info;
  local_238 = TVar7._0_8_;
  Token::Token(&local_230);
  Token::Token(&local_268);
  local_230 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  if (((undefined1  [16])local_230 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
    SVar3 = Token::location(&local_230);
    local_268 = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar3);
    local_1f0 = 0;
    local_1e8 = 0;
    goto LAB_00696811;
  }
  local_1c8._0_8_ = auStack_1b0;
  local_1c8._8_8_ = 0;
  local_1c8._16_8_ = (SyntaxNode *)0x10;
  local_258 = ParserBase::peek(&this->super_ParserBase);
  bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(local_258.kind);
  if (bVar1) {
    bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar1) {
      SVar3 = Token::location(&local_258);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar3);
    }
    local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_0069661c:
    src = local_268.info;
  }
  else {
    bVar1 = slang::syntax::SyntaxFacts::isPossibleTimingCheckArg(local_258.kind);
    if (bVar1) {
      do {
        pTVar4 = parseTimingCheckArg(this);
        local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar4;
        local_200 = CONCAT71(local_200._1_7_,1);
        SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                  ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                   (TokenOrSyntax *)&local_210._M_first);
        TVar7 = ParserBase::peek(&this->super_ParserBase);
        TVar6 = TVar7.kind;
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
        iVar2 = 3;
        src = extraout_RDX;
        if (TVar6 != EndOfFile && !bVar1) {
          if (TVar6 != Comma) {
            ParserBase::expect(&this->super_ParserBase,Comma);
            do {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,false);
              if (!bVar1) {
                local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                src = local_268.info;
                iVar2 = 1;
                goto LAB_0069679b;
              }
              bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
            } while (!bVar1);
          }
          local_210._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_200 = local_200 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (TokenOrSyntax *)&local_210._M_first);
          TVar7 = ParserBase::peek(&this->super_ParserBase);
          TVar6 = TVar7.kind;
          bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar6);
          if (TVar6 == EndOfFile || bVar1) {
            pTVar4 = parseTimingCheckArg(this);
            local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pTVar4;
            local_200 = CONCAT71(local_200._1_7_,1);
            SmallVectorBase<slang::syntax::TokenOrSyntax>::
            emplace_back<slang::syntax::TokenOrSyntax>
                      ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                       (TokenOrSyntax *)&local_210._M_first);
            src = extraout_RDX_01;
          }
          else {
            src = extraout_RDX_00;
            if ((local_258.kind == TVar6) && (local_258.info == TVar7.info)) {
              bVar1 = ParserBase::
                      skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleTimingCheckArg,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                (&this->super_ParserBase,(DiagCode)0x10001,true);
              src = extraout_RDX_02;
              if (!bVar1) goto LAB_0069679b;
            }
            iVar2 = 0;
            local_258 = TVar7;
          }
        }
LAB_0069679b:
      } while (iVar2 == 0);
      if (iVar2 == 3) {
        local_268 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        goto LAB_0069661c;
      }
    }
    else {
      ParserBase::reportMissingList
                (&this->super_ParserBase,local_258,CloseParenthesis,&local_268,(DiagCode)0x10001);
      src = extraout_RDX_03;
    }
  }
  iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_1c8,
                     (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
  local_1e8 = CONCAT44(extraout_var,iVar2);
  local_1f0 = extraout_RDX_04;
  if ((pointer)local_1c8._0_8_ != (pointer)auStack_1b0) {
    operator_delete((void *)local_1c8._0_8_);
  }
LAB_00696811:
  openParen_00 = local_230;
  TVar7 = local_268;
  local_248 = &this->factory;
  local_1c8._8_4_ = 1;
  local_1c8._16_8_ = (SyntaxNode *)0x0;
  auStack_1b0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_1b0._8_8_ = (Info *)0x0;
  auStack_1b0._16_8_ = (pointer)0x0;
  local_198._M_extent_value = 0;
  local_1c8._0_8_ = &PTR_getChild_00cb67f8;
  local_210._8_4_ = 3;
  local_200 = 0;
  uStack_1f8 = 0;
  local_210._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00cc0038;
  local_1d8.kind = local_268.kind;
  local_1d8._2_1_ = local_268._2_1_;
  local_1d8.numFlags.raw = local_268.numFlags.raw;
  local_1d8.rawLen = local_268.rawLen;
  local_1d8.info = local_268.info;
  local_268 = TVar7;
  local_1e0 = local_1f0;
  local_220 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  closeParen_00.info = local_1d8.info;
  closeParen_00.kind = local_1d8.kind;
  closeParen_00._2_1_ = local_1d8._2_1_;
  closeParen_00.numFlags.raw = local_1d8.numFlags.raw;
  closeParen_00.rawLen = local_1d8.rawLen;
  name.info = local_240;
  name.kind = (undefined2)local_238;
  name._2_1_ = local_238._2_1_;
  name.numFlags.raw = local_238._3_1_;
  name.rawLen = local_238._4_4_;
  pSVar5 = slang::syntax::SyntaxFactory::systemTimingCheck
                     (local_248,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_1c8,name
                      ,openParen_00,
                      (SeparatedSyntaxList<slang::syntax::TimingCheckArgSyntax> *)
                      &local_210._M_first,closeParen_00,local_220);
  return pSVar5;
}

Assistant:

SystemTimingCheckSyntax& Parser::parseSystemTimingCheck() {
    auto name = consume();

    Token openParen, closeParen;
    std::span<TokenOrSyntax> list;
    parseList<isPossibleTimingCheckArg, isEndOfParenList>(
        TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma, openParen, list,
        closeParen, RequireItems::True, diag::ExpectedExpression,
        [this] { return &parseTimingCheckArg(); }, AllowEmpty::True);

    return factory.systemTimingCheck(nullptr, name, openParen, list, closeParen,
                                     expect(TokenKind::Semicolon));
}